

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvastexture.cpp
# Opt level: O0

void __thiscall FCanvasTexture::Unload(FCanvasTexture *this)

{
  FCanvasTexture *this_local;
  
  if ((this->bPixelsAllocated & 1U) != 0) {
    if ((this->Pixels != (BYTE *)0x0) && (this->Pixels != (BYTE *)0x0)) {
      operator_delete__(this->Pixels);
    }
    this->bPixelsAllocated = false;
    this->Pixels = (BYTE *)0x0;
  }
  if (this->Canvas != (DSimpleCanvas *)0x0) {
    GC::DelSoftRoot((DObject *)this->Canvas);
    (*(this->Canvas->super_DCanvas).super_DObject._vptr_DObject[4])();
    this->Canvas = (DSimpleCanvas *)0x0;
  }
  return;
}

Assistant:

void FCanvasTexture::Unload ()
{
	if (bPixelsAllocated)
	{
		if (Pixels != NULL) delete [] Pixels;
		bPixelsAllocated = false;
		Pixels = NULL;
	}

	if (Canvas != NULL)
	{
		GC::DelSoftRoot(Canvas);
		Canvas->Destroy();
		Canvas = NULL;
	}
}